

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

ReservedRange * __thiscall
google::protobuf::Descriptor::FindReservedRangeContainingNumber(Descriptor *this,int number)

{
  ReservedRange *pRVar1;
  int i;
  long lVar2;
  
  pRVar1 = *(ReservedRange **)(this + 0x58);
  lVar2 = 0;
  while( true ) {
    if (*(int *)(this + 0x80) <= lVar2) {
      return (ReservedRange *)0x0;
    }
    if ((pRVar1->start <= number) && (number < pRVar1->end)) break;
    lVar2 = lVar2 + 1;
    pRVar1 = pRVar1 + 1;
  }
  return pRVar1;
}

Assistant:

const Descriptor::ReservedRange* Descriptor::FindReservedRangeContainingNumber(
    int number) const {
  // TODO(chrisn): Consider a non-linear search.
  for (int i = 0; i < reserved_range_count(); i++) {
    if (number >= reserved_range(i)->start && number < reserved_range(i)->end) {
      return reserved_range(i);
    }
  }
  return nullptr;
}